

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O0

void prod_histo(qnode_ptr_t f,char *c_fn,char *h_fn,int nbin,float incr,float *ttl_err,
               float *ttl_std,float *dens)

{
  disp_vect_t dVar1;
  bool bVar2;
  undefined8 uVar3;
  qnode_ptr_t q_00;
  disp_field512_t *padVar4;
  FILE *__stream;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined4 in_XMM0_Db;
  double dVar9;
  FILE *fdp;
  int abs_freq;
  int ttl_freq;
  int index1;
  int k;
  int j;
  int i;
  int nbytes;
  int fdf;
  float y;
  float x;
  float t;
  float density;
  float avg_err;
  float err;
  float mag;
  float max_mag;
  histo_t c_histo1 [100];
  histo_t histo1 [100];
  disp_vect_t u;
  qnode_ptr_t q;
  float *ttl_std_local;
  float *ttl_err_local;
  float incr_local;
  int nbin_local;
  char *h_fn_local;
  char *c_fn_local;
  qnode_ptr_t f_local;
  
  fVar5 = (float)(double)CONCAT44(in_XMM0_Db,incr);
  q_00 = create_node(0,f->res,f->sizx,f->sizy,f->sizz,0);
  padVar4 = (disp_field512_t *)malloc(0xc3080);
  q_00->flow_ptr = padVar4;
  load_velocity(q_00,c_fn);
  fVar6 = fVar5 * (float)nbin;
  for (k = 0; k < 100; k = k + 1) {
    c_histo1[(long)k + 99].freq = 0;
    c_histo1[(long)k + 99].avg = 0.0;
    histo1[k].std = 0.0;
    c_histo1[(long)k + -1].freq = 0;
    (&mag)[(long)k * 3] = 0.0;
    c_histo1[k].std = 0.0;
  }
  fdp._0_4_ = 0;
  fdp._4_4_ = 0;
  t = 0.0;
  *ttl_err = 0.0;
  *ttl_std = 0.0;
  for (k = KERNEL_Y + 9; k < (f->sizy - KERNEL_Y) + -9; k = k + 1) {
    for (index1 = KERNEL_X + 9; index1 < (f->sizx - KERNEL_X) + -9; index1 = index1 + 1) {
      abs_freq = (int)(((*f->param_ptr[f->sizz / 2])[f->res * k + index1].mag / fVar6) * (float)nbin
                      );
      dVar1 = (*f->flow_ptr)[f->res * k + index1];
      histo1[99].avg = dVar1.x;
      histo1[99].freq = (int)dVar1.y;
      uVar3 = histo1[99]._4_8_;
      fdp._0_4_ = (int)fdp + 1;
      histo1[99].avg = dVar1.x;
      bVar2 = NAN(histo1[99].avg);
      histo1[99]._4_8_ = uVar3;
      if ((histo1[99].avg != -100.0) || (bVar2)) {
        histo1[99].freq = (int)dVar1.y;
        bVar2 = NAN((float)histo1[99].freq);
        if (((float)histo1[99].freq != 100.0) || (bVar2)) {
          fVar7 = psi_error((*f->flow_ptr)[f->res * k + index1],
                            (*q_00->flow_ptr)[q_00->res * k + index1]);
          t = fVar7 + t;
          fdp._4_4_ = fdp._4_4_ + 1;
          if (nbin <= abs_freq) {
            abs_freq = nbin + -1;
          }
          c_histo1[(long)abs_freq + 99].freq =
               (int)(fVar7 + (float)c_histo1[(long)abs_freq + 99].freq);
          histo1[abs_freq].std = (float)((int)histo1[abs_freq].std + 1);
          for (ttl_freq = 0; ttl_freq <= abs_freq; ttl_freq = ttl_freq + 1) {
            c_histo1[(long)ttl_freq + -1].freq =
                 (int)(fVar7 + (float)c_histo1[(long)ttl_freq + -1].freq);
            c_histo1[ttl_freq].std = (float)((int)c_histo1[ttl_freq].std + 1);
          }
        }
      }
    }
  }
  if ((int)fdp == 0) {
    *dens = 0.0;
  }
  else {
    *dens = (float)fdp._4_4_ / (float)(int)fdp;
  }
  *ttl_err = t / (float)fdp._4_4_;
  fVar7 = *ttl_err;
  for (k = 0; k < nbin; k = k + 1) {
    if (histo1[k].std != 0.0) {
      c_histo1[(long)k + 99].freq =
           (int)((float)c_histo1[(long)k + 99].freq / (float)(int)histo1[k].std);
    }
    if (c_histo1[k].std != 0.0) {
      c_histo1[(long)k + -1].freq =
           (int)((float)c_histo1[(long)k + -1].freq / (float)(int)c_histo1[k].std);
    }
  }
  for (k = KERNEL_Y + 9; k < (f->sizy - KERNEL_Y) + -9; k = k + 1) {
    for (index1 = KERNEL_X + 9; index1 < (f->sizx - KERNEL_X) + -9; index1 = index1 + 1) {
      abs_freq = (int)(((*f->param_ptr[f->sizz / 2])[f->res * k + index1].mag / fVar6) * (float)nbin
                      );
      histo1[99]._4_8_ = (*f->flow_ptr)[f->res * k + index1];
      if ((histo1[99].avg != -100.0) || (NAN(histo1[99].avg))) {
        if (((float)histo1[99].freq != 100.0) || (NAN((float)histo1[99].freq))) {
          fVar8 = psi_error((*f->flow_ptr)[f->res * k + index1],
                            (*q_00->flow_ptr)[q_00->res * k + index1]);
          dVar9 = pow((double)(fVar7 - fVar8),2.0);
          *ttl_std = (float)((double)*ttl_std + dVar9);
          if (nbin <= abs_freq) {
            abs_freq = nbin + -1;
          }
          dVar9 = pow((double)((float)c_histo1[(long)abs_freq + 99].freq - fVar8),2.0);
          c_histo1[(long)abs_freq + 99].avg =
               (float)((double)c_histo1[(long)abs_freq + 99].avg + dVar9);
          for (ttl_freq = 0; ttl_freq <= abs_freq; ttl_freq = ttl_freq + 1) {
            dVar9 = pow((double)((float)c_histo1[(long)ttl_freq + -1].freq - fVar8),2.0);
            (&mag)[(long)ttl_freq * 3] = (float)((double)(&mag)[(long)ttl_freq * 3] + dVar9);
          }
        }
      }
    }
  }
  dVar9 = sqrt((double)(*ttl_std / (float)fdp._4_4_));
  *ttl_std = (float)dVar9;
  for (k = 0; k < nbin; k = k + 1) {
    if (histo1[k].std != 0.0) {
      dVar9 = sqrt((double)(c_histo1[(long)k + 99].avg / (float)(int)histo1[k].std));
      c_histo1[(long)k + 99].avg = (float)dVar9;
    }
    if (c_histo1[k].std != 0.0) {
      dVar9 = sqrt((double)((&mag)[(long)k * 3] / (float)(int)c_histo1[k].std));
      (&mag)[(long)k * 3] = (float)dVar9;
    }
  }
  __stream = fopen(h_fn,"w");
  if (__stream == (FILE *)0x0) {
    error(7);
  }
  fprintf(__stream,"%2d\n",2);
  fprintf(__stream,"%3d\n",(ulong)(uint)nbin);
  fprintf(__stream,"%5.7f\n",(double)fVar6 - (double)fVar5 / 2.0);
  for (k = 0; k < nbin; k = k + 1) {
    fprintf(__stream,"%5.7f %10.7f %10.7f %3.7f\n",
            (double)((fVar6 / (float)nbin) * (float)k) + (double)(fVar6 / (float)nbin) / 2.0,
            (double)(float)c_histo1[(long)k + 99].freq,(double)c_histo1[(long)k + 99].avg,
            (double)((float)(int)histo1[k].std / (float)(int)c_histo1[0].std));
  }
  fprintf(__stream,"\n\n\n");
  fprintf(__stream,"%3d\n",(ulong)(uint)nbin);
  fprintf(__stream,"%5.7f\n",(double)fVar6 - (double)fVar5 / 2.0);
  for (k = 0; k < nbin; k = k + 1) {
    fprintf(__stream,"%5.7f %10.7f %10.7f %3.7f\n",
            (double)((fVar6 / (float)nbin) * (float)k) + (double)(fVar6 / (float)nbin) / 2.0,
            (double)(float)c_histo1[(long)k + -1].freq,(double)(&mag)[(long)k * 3],
            (double)((float)(int)c_histo1[k].std / (float)(int)c_histo1[0].std));
  }
  fclose(__stream);
  return;
}

Assistant:

void prod_histo(f,c_fn,h_fn,nbin,incr,ttl_err,ttl_std,dens)
qnode_ptr_t f ;
string c_fn, h_fn ;
float incr, *ttl_err, *ttl_std, *dens ;
int nbin ;

{ qnode_ptr_t create_node(), q ;
  disp_vect_t u ;
  histo_t histo1[N_BINS], c_histo1[N_BINS] ;
  float psi_error(), max_mag, mag, err, avg_err, density, t, x, y ;
  int fdf, nbytes, i, j, k, index1, ttl_freq, abs_freq ;
  FILE *fdp ;
  extern int KERNEL_X, KERNEL_Y ;

  q = create_node(0,f->res,f->sizx,f->sizy,f->sizz,0) ;
  q->flow_ptr = (disp_field512_t *)malloc(sizeof(disp_field512_t)) ;
  load_velocity(q,c_fn) ;

  max_mag = incr*(float)nbin ;
  for (i = 0 ; i < N_BINS ; i++) {
    histo1[i].avg = 0.0 ;
    histo1[i].std = 0.0 ;
    histo1[i].freq = 0 ;
    c_histo1[i].avg = 0.0 ;
    c_histo1[i].std = 0.0 ;
    c_histo1[i].freq = 0 ;
  }
  abs_freq = 0 ;
  ttl_freq = 0 ;
  avg_err = 0.0 ;
  *ttl_err = 0.0 ;
  *ttl_std = 0.0 ;

  for (i = KERNEL_Y + NRADIUS ; i < f->sizy - KERNEL_Y - NRADIUS ; i++) {
    for (j = KERNEL_X + NRADIUS ; j < f->sizx -  KERNEL_X - NRADIUS ; j++) {
      mag = (*f->param_ptr[f->sizz/2])[f->res*i + j].mag ;
      index1 = (int)((mag/max_mag)*(float)nbin) ;
      u = (*f->flow_ptr)[f->res*i+j] ;
      abs_freq++ ;
      if (u.x != -100.0 && u.y != 100.0) {
        err = psi_error((*f->flow_ptr)[f->res*i+j],(*q->flow_ptr)[q->res*i+j]) ;
        avg_err += err ;
        ttl_freq++ ;
        if (index1 >= nbin) {
          index1 = nbin - 1 ;
        }
        histo1[index1].avg += err ;
        histo1[index1].freq++ ;
        for (k = 0 ; k <= index1 ; k++) {
          c_histo1[k].avg += err ;
          c_histo1[k].freq++ ;
        }
      }
    }
  }
  if (abs_freq != 0) {
    *dens = (float)ttl_freq/(float)abs_freq ;
  }
  else {
    *dens = 0.0 ;
  }
  *ttl_err = avg_err/(float)ttl_freq ;
  avg_err = *ttl_err ;
  for (i = 0 ; i < nbin ; i++) {
    if (histo1[i].freq != 0) {
      histo1[i].avg /= (float)histo1[i].freq ;
    }
    if (c_histo1[i].freq != 0) {
      c_histo1[i].avg /= (float)c_histo1[i].freq ;
    }
  }
  for (i = KERNEL_Y + NRADIUS ; i < f->sizy - KERNEL_Y - NRADIUS ; i++) {
    for (j = KERNEL_X + NRADIUS ; j < f->sizx - KERNEL_X - NRADIUS ; j++) {
      mag = (*f->param_ptr[f->sizz/2])[f->res*i + j].mag ;
      index1 = (int)((mag/max_mag)*(float)nbin) ;
      u = (*f->flow_ptr)[f->res*i+j] ;
      if (u.x != -100.0 && u.y != 100.0) {
        err = psi_error((*f->flow_ptr)[f->res*i+j],(*q->flow_ptr)[q->res*i+j]) ;
        *ttl_std += pow(avg_err - err,2.0) ;
        if (index1 >= nbin) {
          index1 = nbin - 1 ;
        }
        histo1[index1].std += pow(histo1[index1].avg - err,2.0) ;
        for (k = 0 ; k <= index1 ; k++) {
          c_histo1[k].std += pow(c_histo1[k].avg - err,2.0) ;
        }
      }
    }
  }
  *ttl_std = sqrt(*ttl_std/(float)ttl_freq) ;
  for (i = 0 ; i < nbin ; i++) {
    if (histo1[i].freq != 0) {
      histo1[i].std = sqrt(histo1[i].std/(float)histo1[i].freq) ;
    }
    if (c_histo1[i].freq != 0) {
      c_histo1[i].std = sqrt(c_histo1[i].std/(float)c_histo1[i].freq) ;
    }
  }
  if ((fdp = fopen(h_fn,"w")) == NULL) {
    error(7) ;
  }

  density = c_histo1[0].freq ;
  fprintf(fdp,"%2d\n",N_HISTO) ;
  fprintf(fdp,"%3d\n",nbin) ;
  fprintf(fdp,"%5.7f\n",max_mag - incr/2.0) ;
  for (i = 0 ; i < nbin ; i++) {
    t = max_mag/(float)nbin ;
    fprintf(fdp,"%5.7f %10.7f %10.7f %3.7f\n", t*(float)(i)+t/2.0,
    histo1[i].avg, histo1[i].std, (float)histo1[i].freq/density) ;
  }
  fprintf(fdp,"\n\n\n") ;

  fprintf(fdp,"%3d\n",nbin) ;
  fprintf(fdp,"%5.7f\n",max_mag - incr/2.0) ;
  for (i = 0 ; i < nbin ; i++) {
    t = max_mag/(float)nbin ;
    fprintf(fdp,"%5.7f %10.7f %10.7f %3.7f\n", t*(float)(i)+t/2.0,
    c_histo1[i].avg, c_histo1[i].std, (float)c_histo1[i].freq/density) ;
  }
  fclose(fdp) ;
}